

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  element_type *this_00;
  char *pcVar4;
  reference puVar5;
  pointer pOVar6;
  size_t sVar7;
  ArgumentMismatch *__return_storage_ptr__;
  RequiresError *this_01;
  reference ppOVar8;
  ExcludesError *this_02;
  size_type sVar9;
  RequiredError *pRVar10;
  ExtrasError *this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  undefined1 local_2b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  size_t local_280;
  size_t num_left_over;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  string local_258;
  string local_238;
  Option *local_218;
  Option *opt_ex;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  string local_1f0;
  string local_1d0;
  Option *local_1b0;
  Option *opt_req;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  string local_188;
  undefined1 local_161;
  string local_160;
  reference local_140;
  Option_p *opt_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_3;
  Option_p *opt_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_2;
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [8];
  string ename_string;
  char *buffer;
  Option_p *opt_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_1;
  FileError *anon_var_0;
  undefined1 local_58 [8];
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  Option_p *opt;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool positional_only;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  this->parsed_ = true;
  __range2._7_1_ = 0;
  pvStack_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  while (bVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(pvStack_18), ((bVar1 ^ 0xffU) & 1) != 0) {
    _parse_single(this,pvStack_18,(bool *)((long)&__range2 + 7));
  }
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                     *)&opt), bVar1) {
    values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                  ::operator*(&__end2);
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                       ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                        values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = Option::get_short_circuit(pOVar6);
    if (bVar1) {
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                          values.
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar7 = Option::count(pOVar6);
      if (sVar7 != 0) {
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            values.
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        Option::run_callback(pOVar6);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  }
  if (this->config_ptr_ != (Option *)0x0) {
    bVar1 = Option::operator_cast_to_bool(this->config_ptr_);
    if (bVar1) {
      Option::run_callback(this->config_ptr_);
      this->config_required_ = true;
    }
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      this_00 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->config_formatter_);
      Config::from_file((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_58,
                        this_00,&this->config_name_);
      _parse_config(this,(vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_58);
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_58);
    }
  }
  __end2_1 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
  opt_1 = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                             *)&opt_1), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
             ::operator*(&__end2_1);
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar5);
    sVar7 = Option::count(pOVar6);
    if (sVar7 == 0) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar5);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        ename_string.field_2._8_8_ = 0;
        ::std::__cxx11::string::string(local_b8);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar5);
        pcVar4 = (char *)::std::__cxx11::string::c_str();
        pcVar4 = getenv(pcVar4);
        ename_string.field_2._8_8_ = pcVar4;
        if (pcVar4 != (char *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>(local_d8,pcVar4,&local_d9);
          ::std::__cxx11::string::operator=(local_b8,local_d8);
          ::std::__cxx11::string::~string(local_d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        }
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (puVar5);
          ::std::__cxx11::string::string((string *)&__range2_2,local_b8);
          Option::add_result(pOVar6,(string *)&__range2_2);
          ::std::__cxx11::string::~string((string *)&__range2_2);
        }
        ::std::__cxx11::string::~string(local_b8);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
  opt_2 = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                             *)&opt_2), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
             ::operator*(&__end2_2);
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar5);
    sVar7 = Option::count(pOVar6);
    if (sVar7 != 0) {
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar5);
      bVar1 = Option::get_callback_run(pOVar6);
      if (!bVar1) {
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puVar5)
        ;
        Option::run_callback(pOVar6);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
  opt_3 = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                        *)&opt_3);
    if (!bVar1) {
      get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&num_left_over,this);
      uVar3 = this->require_subcommand_min_;
      sVar9 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&num_left_over);
      if (sVar9 < uVar3) {
        pRVar10 = (RequiredError *)__cxa_allocate_exception(0x38);
        RequiredError::Subcommand(pRVar10,this->require_subcommand_min_);
        __cxa_throw(pRVar10,&RequiredError::typeinfo,RequiredError::~RequiredError);
      }
      if (((this->allow_extras_ & 1U) == 0) && ((this->prefix_command_ & 1U) == 0)) {
        local_280 = remaining_size(this,false);
        if (local_280 != 0) {
          remaining_abi_cxx11_(&local_298,this,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(pvStack_18,&local_298);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_298);
          local_2b1 = 1;
          this_03 = (ExtrasError *)__cxa_allocate_exception(0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_2b0,pvStack_18);
          ExtrasError::ExtrasError(this_03,&local_2b0);
          local_2b1 = 0;
          __cxa_throw(this_03,&ExtrasError::typeinfo,ExtrasError::~ExtrasError);
        }
        local_280 = 0;
      }
      if (this->parent_ == (App *)0x0) {
        remaining_abi_cxx11_(&local_2d0,this,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(pvStack_18,&local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2d0);
      }
      std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
                ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&num_left_over);
      return;
    }
    local_140 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                ::operator*(&__end2_3);
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_140);
    bVar1 = OptionBase<CLI::Option>::get_required(&pOVar6->super_OptionBase<CLI::Option>);
    if (bVar1) {
LAB_0012878d:
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_140);
      iVar2 = Option::get_items_expected(pOVar6);
      if (iVar2 < 0) {
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_140);
        sVar7 = Option::count(pOVar6);
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_140);
        iVar2 = Option::get_items_expected(pOVar6);
        if (sVar7 < (ulong)(long)-iVar2) {
          local_161 = 1;
          __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_140);
          Option::get_name_abi_cxx11_(&local_160,pOVar6,false,false);
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_140);
          iVar2 = Option::get_items_expected(pOVar6);
          ArgumentMismatch::AtLeast(__return_storage_ptr__,&local_160,-iVar2);
          local_161 = 0;
          __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,
                      ArgumentMismatch::~ArgumentMismatch);
        }
      }
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_140);
      bVar1 = OptionBase<CLI::Option>::get_required(&pOVar6->super_OptionBase<CLI::Option>);
      if (bVar1) {
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_140);
        sVar7 = Option::count(pOVar6);
        if (sVar7 == 0) {
          pRVar10 = (RequiredError *)__cxa_allocate_exception(0x38);
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_140);
          Option::get_name_abi_cxx11_(&local_188,pOVar6,false,false);
          RequiredError::RequiredError(pRVar10,&local_188);
          __cxa_throw(pRVar10,&RequiredError::typeinfo,RequiredError::~RequiredError);
        }
      }
    }
    else {
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_140);
      sVar7 = Option::count(pOVar6);
      if (sVar7 != 0) goto LAB_0012878d;
    }
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_140);
    __end3 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
             begin(&pOVar6->requires_);
    opt_req = (Option *)
              std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                        (&pOVar6->requires_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&opt_req), bVar1) {
      ppOVar8 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3);
      local_1b0 = *ppOVar8;
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_140);
      sVar7 = Option::count(pOVar6);
      if ((sVar7 != 0) && (sVar7 = Option::count(local_1b0), sVar7 == 0)) {
        this_01 = (RequiresError *)__cxa_allocate_exception(0x38);
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_140);
        Option::get_name_abi_cxx11_(&local_1d0,pOVar6,false,false);
        Option::get_name_abi_cxx11_(&local_1f0,local_1b0,false,false);
        RequiresError::RequiresError(this_01,&local_1d0,&local_1f0);
        __cxa_throw(this_01,&RequiresError::typeinfo,RequiresError::~RequiresError);
      }
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3);
    }
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_140);
    __end3_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin(&pOVar6->excludes_);
    opt_ex = (Option *)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                       (&pOVar6->excludes_);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&opt_ex), bVar1) {
      ppOVar8 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3_1);
      local_218 = *ppOVar8;
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_140);
      sVar7 = Option::count(pOVar6);
      if ((sVar7 != 0) && (sVar7 = Option::count(local_218), sVar7 != 0)) {
        selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        this_02 = (ExcludesError *)__cxa_allocate_exception(0x38);
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_140);
        Option::get_name_abi_cxx11_(&local_238,pOVar6,false,false);
        Option::get_name_abi_cxx11_(&local_258,local_218,false,false);
        ExcludesError::ExcludesError(this_02,&local_238,&local_258);
        selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(this_02,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
      }
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3_1);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2_3);
  } while( true );
}

Assistant:

void _parse(std::vector<std::string> &args) {
        parsed_ = true;
        bool positional_only = false;

        while(!args.empty()) {
            _parse_single(args, positional_only);
        }

        for(const Option_p &opt : options_)
            if(opt->get_short_circuit() && opt->count() > 0)
                opt->run_callback();

        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<ConfigItem> values = config_formatter_->from_file(config_name_);
                    _parse_config(values);
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }

        // Get envname options if not yet passed
        for(const Option_p &opt : options_) {
            if(opt->count() == 0 && !opt->envname_.empty()) {
                char *buffer = nullptr;
                std::string ename_string;

#ifdef _MSC_VER
                // Windows version
                size_t sz = 0;
                if(_dupenv_s(&buffer, &sz, opt->envname_.c_str()) == 0 && buffer != nullptr) {
                    ename_string = std::string(buffer);
                    free(buffer);
                }
#else
                // This also works on Windows, but gives a warning
                buffer = std::getenv(opt->envname_.c_str());
                if(buffer != nullptr)
                    ename_string = std::string(buffer);
#endif

                if(!ename_string.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }

        // Process callbacks
        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }

        // Verify required options
        for(const Option_p &opt : options_) {
            // Required or partially filled
            if(opt->get_required() || opt->count() != 0) {
                // Make sure enough -N arguments parsed (+N is already handled in parsing function)
                if(opt->get_items_expected() < 0 && opt->count() < static_cast<size_t>(-opt->get_items_expected()))
                    throw ArgumentMismatch::AtLeast(opt->get_name(), -opt->get_items_expected());

                // Required but empty
                if(opt->get_required() && opt->count() == 0)
                    throw RequiredError(opt->get_name());
            }
            // Requires
            for(const Option *opt_req : opt->requires_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->get_name(), opt_req->get_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->get_name(), opt_ex->get_name());
        }

        auto selected_subcommands = get_subcommands();
        if(require_subcommand_min_ > selected_subcommands.size())
            throw RequiredError::Subcommand(require_subcommand_min_);

        // Convert missing (pairs) to extras (string only)
        if(!(allow_extras_ || prefix_command_)) {
            size_t num_left_over = remaining_size();
            if(num_left_over > 0) {
                args = remaining(false);
                throw ExtrasError(args);
            }
        }

        if(parent_ == nullptr) {
            args = remaining(false);
        }
    }